

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

int zmq_poller_destroy(void **poller_p_)

{
  socket_poller_t *this;
  bool bVar1;
  int *piVar2;
  undefined8 *in_RDI;
  socket_poller_t *unaff_retaddr;
  socket_poller_t *poller;
  int local_4;
  
  if (((in_RDI == (undefined8 *)0x0) ||
      (this = (socket_poller_t *)*in_RDI, this == (socket_poller_t *)0x0)) ||
     (bVar1 = zmq::socket_poller_t::check_tag(this), !bVar1)) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    local_4 = -1;
  }
  else {
    if (this != (socket_poller_t *)0x0) {
      zmq::socket_poller_t::~socket_poller_t(unaff_retaddr);
      operator_delete(this,0x38);
    }
    *in_RDI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq_poller_destroy (void **poller_p_)
{
    if (poller_p_) {
        const zmq::socket_poller_t *const poller =
          static_cast<const zmq::socket_poller_t *> (*poller_p_);
        if (poller && poller->check_tag ()) {
            delete poller;
            *poller_p_ = NULL;
            return 0;
        }
    }
    errno = EFAULT;
    return -1;
}